

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createExpressions.cpp
# Opt level: O1

string * getAsmUsedRegString_abi_cxx11_(string *__return_storage_ptr__,ConstraintInfoVector *info)

{
  int iVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  bool bVar3;
  long *plVar4;
  int *piVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string clobber;
  long *local_338 [2];
  long local_328 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if (getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
      ::CLOBBER_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                                 ::CLOBBER_abi_cxx11_);
    if (iVar1 != 0) {
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"memory","");
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"rax","");
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"eax","");
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"ax","");
      local_290[0] = local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"al","");
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"rbx","");
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"ebx","");
      local_230[0] = local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"bx","");
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"bl","");
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"rcx","");
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"ecx","");
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"cx","");
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"cl","");
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"rdx","");
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"edx","");
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"dx","");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"dl","");
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"rsi","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"esi","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"si","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"rdi","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"edi","");
      plVar4 = local_40;
      local_50[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"di","");
      __l._M_len = 0x17;
      __l._M_array = &local_310;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                ::CLOBBER_abi_cxx11_,__l,(allocator_type *)local_338);
      lVar6 = -0x2e0;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                    ::CLOBBER_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                           ::CLOBBER_abi_cxx11_);
    }
  }
  local_318 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_318;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar5 = *(int **)info;
  if (piVar5 != *(int **)(info + 8)) {
    bVar3 = true;
    do {
      if (*piVar5 == 2) {
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        lVar6 = **(long **)(piVar5 + 4);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,lVar6,(*(long **)(piVar5 + 4))[1] + lVar6);
        std::__cxx11::string::substr((ulong)local_338,(ulong)&local_310);
        std::__cxx11::string::operator=((string *)&local_310,(string *)local_338);
        if (local_338[0] != local_328) {
          operator_delete(local_338[0],local_328[0] + 1);
        }
        _Var2 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                           ::CLOBBER_abi_cxx11_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                           ::CLOBBER_abi_cxx11_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_310);
        if (_Var2._M_current !=
            getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
            ::CLOBBER_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (!bVar3) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          iVar1 = std::__cxx11::string::compare((char *)&local_310);
          if (iVar1 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_338[0] = local_328;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,local_310._M_dataplus._M_p,
                     local_310._M_dataplus._M_p + local_310._M_string_length);
          std::__cxx11::string::append((char *)local_338);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_338[0]);
          if (local_338[0] != local_328) {
            operator_delete(local_338[0],local_328[0] + 1);
          }
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      piVar5 = piVar5 + 0x14;
    } while (piVar5 != *(int **)(info + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getAsmUsedRegString(llvm::InlineAsm::ConstraintInfoVector info) {
    static std::vector<std::string> CLOBBER = {"memory", "rax", "eax", "ax", "al", "rbx", "ebx", "bx", "bl", "rcx", "ecx", "cx",
                                               "cl", "rdx", "edx", "dx", "dl", "rsi", "esi", "si", "rdi", "edi", "di"};

    std::string ret;
    bool first = true;

    for (llvm::InlineAsm::ConstraintInfoVector::iterator iter = info.begin(); iter != info.end(); iter++) {
        if (iter->Type != llvm::InlineAsm::isClobber) {
            continue;
        }

        std::string clobber = iter->Codes[0];
        clobber = clobber.substr(1, clobber.size() - 2);

        if (std::find(CLOBBER.begin(), CLOBBER.end(), clobber) != CLOBBER.end()) {
            if (!first) {
                ret += ", ";
            }
            first = false;

            ret += "\"";
            if (clobber.compare("memory") != 0) {
                ret += "%";
            }
            ret += clobber + "\"";
        }
    }

    return ret;
}